

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathUtils.h
# Opt level: O0

optional<unsigned_long> slang::checkedMulU64(uint64_t a,uint64_t b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 extraout_RDX;
  ulong in_RSI;
  ulong in_RDI;
  _Optional_payload_base<unsigned_long> _Var3;
  optional<unsigned_long> oVar4;
  uint64_t result;
  _Storage<unsigned_long,_true> local_10;
  undefined1 local_8;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RDI;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_RSI;
  if (SUB168(auVar1 * auVar2,8) == 0) {
    _Var3 = (_Optional_payload_base<unsigned_long>)
            std::make_optional<unsigned_long&>((unsigned_long *)0x5551af);
    local_8 = _Var3._M_engaged;
  }
  else {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&local_10);
    _Var3._8_8_ = extraout_RDX;
    _Var3._M_payload._M_value = local_10._M_value;
  }
  local_10 = _Var3._M_payload;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = _Var3._9_7_;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_8;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_10._M_value;
  return (optional<unsigned_long>)
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

inline std::optional<uint64_t> checkedMulU64(uint64_t a, uint64_t b) {
#if defined(_MSC_VER)
    uint64_t high;
    auto result = _umul128(a, b, &high);
    return high ? std::nullopt : std::make_optional(result);
#else
    uint64_t result;
    return __builtin_mul_overflow(a, b, &result) ? std::nullopt : std::make_optional(result);
#endif
}